

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
file_loader::operator()
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,file_loader *this,
          string *name,string *param_2)

{
  size_type __new_size;
  ifstream f;
  value_type local_219;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_218,(name->_M_dataplus)._M_p,_S_bin);
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_218,_S_beg);
    __new_size = std::istream::tellg();
    if (__new_size != 0) {
      std::istream::seekg(local_218,0,0);
      local_219 = '\0';
      std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,__new_size,&local_219)
      ;
      std::istream::read((char *)local_218,
                         (long)(__return_storage_ptr__->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start);
      file_loader_is_actually_called = true;
    }
  }
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> operator()(std::string const &name,std::string const &/*encoding*/) const
    {
        std::vector<char> buffer;
        std::ifstream f(name.c_str(),std::ifstream::binary);
        if(!f)
            return buffer;
        f.seekg(0,std::ifstream::end);
        size_t len = f.tellg();
        if(len == 0)
            return buffer;
        f.seekg(0);
        buffer.resize(len,'\0');
        f.read(&buffer[0],len);
        file_loader_is_actually_called = true;
        return buffer;
    }